

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O0

int __thiscall
TPZMatrix<Fad<double>_>::GetSub
          (TPZMatrix<Fad<double>_> *this,int64_t sRow,int64_t sCol,int64_t rowSize,int64_t colSize,
          TPZFMatrix<Fad<double>_> *A)

{
  long lVar1;
  int iVar2;
  int64_t iVar3;
  long lVar4;
  long in_RCX;
  long in_RDX;
  long in_RSI;
  TPZBaseMatrix *in_RDI;
  long in_R8;
  Fad<double> *in_R9;
  int64_t c;
  int64_t col;
  int64_t r;
  int64_t row;
  char *in_stack_00000138;
  char *in_stack_00000140;
  Fad<double> *this_00;
  undefined1 local_78 [32];
  long local_58;
  long local_50;
  long local_48;
  long local_40;
  Fad<double> *local_38;
  long local_30;
  long local_28;
  long local_20;
  long local_18;
  
  local_38 = in_R9;
  local_30 = in_R8;
  local_28 = in_RCX;
  local_20 = in_RDX;
  local_18 = in_RSI;
  iVar3 = TPZBaseMatrix::Rows(in_RDI);
  if ((in_RSI + in_RCX <= iVar3) &&
     (lVar4 = local_20 + local_30, iVar3 = TPZBaseMatrix::Cols(in_RDI), lVar4 <= iVar3)) {
    (**(code **)((long)local_38->val_ + 0x68))(local_38,local_28,local_30);
    local_40 = local_18;
    for (local_48 = 0; local_48 < local_28; local_48 = local_48 + 1) {
      local_50 = local_20;
      for (local_58 = 0; lVar1 = local_48, lVar4 = local_58, local_58 < local_30;
          local_58 = local_58 + 1) {
        this_00 = local_38;
        (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x24])(local_78,in_RDI,local_40,local_50);
        (**(code **)((long)this_00->val_ + 0x118))(this_00,lVar1,lVar4,local_78);
        Fad<double>::~Fad(this_00);
        local_50 = local_50 + 1;
      }
      local_40 = local_40 + 1;
    }
    return 1;
  }
  iVar2 = Error(in_stack_00000140,in_stack_00000138);
  return iVar2;
}

Assistant:

int TPZMatrix<TVar>::GetSub(const int64_t sRow,const int64_t sCol,const int64_t rowSize,
							const int64_t colSize, TPZFMatrix<TVar> & A ) const {
    if ( ((sRow + rowSize) > Rows()) || ((sCol + colSize) > Cols()) ) {
        return( Error( "GetSub <t.he sub-matrix is too big>" ) );
    }
    A.Resize( rowSize, colSize );
    int64_t row = sRow;
    for ( int64_t r = 0; r < rowSize; r++, row++ ) {
        int64_t col = sCol;
        for ( int64_t c = 0; c < colSize; c++, col++ ) {
            A.PutVal( r, c, GetVal( row, col ) );
        }
    }
    return( 1 );
}